

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::
emplace_helper<QSslServerPrivate::SocketData>
          (QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *this,unsigned_long_long *key,
          SocketData *args)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  piter pVar7;
  Node<unsigned_long_long,_QSslServerPrivate::SocketData> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::
  findOrInsert<unsigned_long_long>((InsertionResult *)local_38,this->d,key);
  this_00 = (Node<unsigned_long_long,_QSslServerPrivate::SocketData> *)
            ((((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries)->storage).
             data + (uint)(*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
                          [(uint)local_38._8_8_ & 0x7f] * 0x28);
  if (local_38[0x10] == false) {
    this_00->key = *key;
    pvVar1 = (args->readyReadConnection).d_ptr;
    (args->readyReadConnection).d_ptr = (void *)0x0;
    (this_00->value).readyReadConnection.d_ptr = pvVar1;
    uVar3 = *(undefined4 *)&(args->destroyedConnection).d_ptr;
    uVar4 = *(undefined4 *)((long)&(args->destroyedConnection).d_ptr + 4);
    uVar5 = *(undefined4 *)
             &(args->timeoutTimer).super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar6 = *(undefined4 *)
             ((long)&(args->timeoutTimer).super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr + 4);
    (args->destroyedConnection).d_ptr = (void *)0x0;
    *(undefined4 *)&(this_00->value).destroyedConnection.d_ptr = uVar3;
    *(undefined4 *)((long)&(this_00->value).destroyedConnection.d_ptr + 4) = uVar4;
    *(undefined4 *)
     &(this_00->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         uVar5;
    *(undefined4 *)
     ((long)&(this_00->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr + 4) = uVar6;
    (this_00->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (args->timeoutTimer).super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (args->timeoutTimer).super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this_00->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = p_Var2;
    (args->timeoutTimer).super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>::
    emplaceValue<QSslServerPrivate::SocketData>(this_00,args);
  }
  pVar7.bucket = local_38._8_8_;
  pVar7.d = (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar7;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }